

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_to_lower_bound.hpp
# Opt level: O1

void burst::
     skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,int,std::less<void>>
               (undefined8 *range)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  
  piVar2 = (int *)*range;
  piVar3 = (int *)range[1];
  piVar5 = piVar3;
  if (piVar2 != piVar3) {
    do {
      piVar4 = piVar2 + 1;
      piVar5 = piVar3;
      if (piVar4 == piVar3) break;
      iVar1 = *piVar2;
      piVar5 = piVar4;
      piVar2 = piVar4;
    } while (iVar1 <= *piVar4);
  }
  if (piVar5 != piVar3) {
    __assert_fail("boost::algorithm::is_sorted(range, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/range/skip_to_lower_bound.hpp"
                  ,0x18,
                  "void burst::skip_to_lower_bound(Range &, const Value &, Compare) [Range = boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>, Value = int, Compare = std::less<void>]"
                 );
  }
  detail::
  skip_to_lower_bound<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,int,std::less<void>>
            ();
  return;
}

Assistant:

void skip_to_lower_bound (Range & range, const Value & goal, Compare compare)
    {
        BOOST_ASSERT(boost::algorithm::is_sorted(range, compare));
        detail::skip_to_lower_bound(range, goal, compare);
    }